

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

uchar * stbtt_GetGlyphBitmapSubpixel
                  (stbtt_fontinfo *info,float scale_x,float scale_y,float shift_x,float shift_y,
                  int glyph,int *width,int *height,int *xoff,int *yoff)

{
  uchar *puVar1;
  int iVar2;
  float scale_x_00;
  float scale_y_00;
  void *in_stack_ffffffffffffff58;
  stbtt__bitmap local_98;
  int local_7c;
  int local_78;
  int ix0;
  int ix1;
  int iy1;
  int *local_68;
  int *local_60;
  int *local_58;
  int local_50;
  int local_4c;
  int iy0;
  stbtt_vertex *vertices;
  float local_38;
  float local_34;
  
  _ix1 = height;
  local_68 = width;
  vertices._0_4_ = shift_y;
  vertices._4_4_ = shift_x;
  local_38 = scale_x;
  local_34 = scale_y;
  local_4c = stbtt_GetGlyphShape(info,glyph,(stbtt_vertex **)&iy0);
  scale_x_00 = local_38;
  if ((local_38 == 0.0) && (!NAN(local_38))) {
    scale_x_00 = local_34;
  }
  scale_y_00 = local_34;
  if ((local_34 == 0.0) && (!NAN(local_34))) {
    scale_y_00 = scale_x_00;
  }
  if (local_38 == 0.0 && local_34 == 0.0) {
    free(_iy0);
    puVar1 = (uchar *)0x0;
  }
  else {
    local_60 = yoff;
    local_58 = xoff;
    local_38 = scale_x_00;
    local_34 = scale_y_00;
    stbtt_GetGlyphBitmapBoxSubpixel
              (info,glyph,scale_x_00,scale_y_00,vertices._4_4_,vertices._0_4_,&local_7c,&local_50,
               &local_78,&ix0);
    iVar2 = local_78 - local_7c;
    local_98.h = ix0 - local_50;
    if (local_68 != (int *)0x0) {
      *local_68 = iVar2;
    }
    if (_ix1 != (int *)0x0) {
      *_ix1 = local_98.h;
    }
    if (local_58 != (int *)0x0) {
      *local_58 = local_7c;
    }
    if (local_60 != (int *)0x0) {
      *local_60 = local_50;
    }
    local_98.w = iVar2;
    if ((local_78 == local_7c || ix0 == local_50) ||
       (puVar1 = (uchar *)malloc((long)(local_98.h * iVar2)), local_98.pixels = puVar1,
       puVar1 == (uchar *)0x0)) {
      puVar1 = (uchar *)0x0;
    }
    else {
      local_98.stride = iVar2;
      stbtt_Rasterize(&local_98,0.35,_iy0,local_4c,local_38,local_34,vertices._4_4_,vertices._0_4_,
                      local_7c,local_50,1,in_stack_ffffffffffffff58);
    }
    free(_iy0);
  }
  return puVar1;
}

Assistant:

STBTT_DEF unsigned char *stbtt_GetGlyphBitmapSubpixel(const stbtt_fontinfo *info, float scale_x, float scale_y, float shift_x, float shift_y, int glyph, int *width, int *height, int *xoff, int *yoff)
{
   int ix0,iy0,ix1,iy1;
   stbtt__bitmap gbm;
   stbtt_vertex *vertices;   
   int num_verts = stbtt_GetGlyphShape(info, glyph, &vertices);

   if (scale_x == 0) scale_x = scale_y;
   if (scale_y == 0) {
      if (scale_x == 0) {
         STBTT_free(vertices, info->userdata);
         return NULL;
      }
      scale_y = scale_x;
   }

   stbtt_GetGlyphBitmapBoxSubpixel(info, glyph, scale_x, scale_y, shift_x, shift_y, &ix0,&iy0,&ix1,&iy1);

   // now we get the size
   gbm.w = (ix1 - ix0);
   gbm.h = (iy1 - iy0);
   gbm.pixels = NULL; // in case we error

   if (width ) *width  = gbm.w;
   if (height) *height = gbm.h;
   if (xoff  ) *xoff   = ix0;
   if (yoff  ) *yoff   = iy0;
   
   if (gbm.w && gbm.h) {
      gbm.pixels = (unsigned char *) STBTT_malloc(gbm.w * gbm.h, info->userdata);
      if (gbm.pixels) {
         gbm.stride = gbm.w;

         stbtt_Rasterize(&gbm, 0.35f, vertices, num_verts, scale_x, scale_y, shift_x, shift_y, ix0, iy0, 1, info->userdata);
      }
   }
   STBTT_free(vertices, info->userdata);
   return gbm.pixels;
}